

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int parseHhMmSs(char *zDate,DateTime *p)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  byte *pbVar7;
  byte *zDate_00;
  double dVar8;
  double dVar9;
  int s;
  int m;
  int h;
  int nMn;
  int nHr;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  iVar3 = getDigits(zDate,"20c:20e",&local_34,&local_38);
  if (iVar3 != 2) {
    return 1;
  }
  if (zDate[5] == ':') {
    iVar3 = getDigits(zDate + 6,"20e",&local_3c);
    if (iVar3 != 1) {
      return 1;
    }
    zDate_00 = (byte *)(zDate + 8);
    dVar8 = 0.0;
    if ((zDate[8] == '.') && (uVar5 = (ulong)(byte)zDate[9], 0xfffffffffffffff5 < uVar5 - 0x3a)) {
      zDate_00 = (byte *)(zDate + 9);
      dVar9 = 1.0;
      do {
        dVar8 = dVar8 * 10.0 + (double)(int)(char)uVar5 + -48.0;
        dVar9 = dVar9 * 10.0;
        uVar5 = (ulong)zDate_00[1];
        zDate_00 = zDate_00 + 1;
      } while (0xfffffffffffffff5 < uVar5 - 0x3a);
      dVar8 = dVar8 / dVar9;
    }
  }
  else {
    zDate_00 = (byte *)(zDate + 5);
    local_3c = 0;
    dVar8 = 0.0;
  }
  p->validJD = '\0';
  p->rawS = '\0';
  p->validHMS = '\x01';
  p->h = local_34;
  p->m = local_38;
  p->s = (double)local_3c + dVar8;
  do {
    pbVar7 = zDate_00;
    zDate_00 = pbVar7 + 1;
  } while ((""[*pbVar7] & 1) != 0);
  p->tz = 0;
  bVar6 = *pbVar7;
  if (bVar6 == 0x2d) {
    iVar3 = -1;
LAB_0019e84d:
    iVar4 = getDigits((char *)zDate_00,"20b:20e",&local_2c,&local_30);
    if (iVar4 != 2) {
      return 1;
    }
    local_30 = local_2c * 0x3c + local_30;
    p->tz = iVar3 * local_30;
    zDate_00 = pbVar7 + 6;
    bVar1 = local_30 != 0;
  }
  else {
    if (bVar6 == 0x2b) {
      iVar3 = 1;
      goto LAB_0019e84d;
    }
    bVar2 = false;
    bVar1 = false;
    if ((bVar6 & 0xdf) != 0x5a) goto LAB_0019e8ab;
  }
  do {
    bVar2 = bVar1;
    pbVar7 = zDate_00;
    zDate_00 = pbVar7 + 1;
    bVar1 = bVar2;
  } while ((""[*pbVar7] & 1) != 0);
  p->tzSet = '\x01';
  bVar6 = *pbVar7;
LAB_0019e8ab:
  if (bVar6 == 0) {
    p->validTZ = bVar2;
  }
  return (uint)(bVar6 != 0);
}

Assistant:

static int parseHhMmSs(const char *zDate, DateTime *p){
  int h, m, s;
  double ms = 0.0;
  if( getDigits(zDate, "20c:20e", &h, &m)!=2 ){
    return 1;
  }
  zDate += 5;
  if( *zDate==':' ){
    zDate++;
    if( getDigits(zDate, "20e", &s)!=1 ){
      return 1;
    }
    zDate += 2;
    if( *zDate=='.' && sqlite3Isdigit(zDate[1]) ){
      double rScale = 1.0;
      zDate++;
      while( sqlite3Isdigit(*zDate) ){
        ms = ms*10.0 + *zDate - '0';
        rScale *= 10.0;
        zDate++;
      }
      ms /= rScale;
    }
  }else{
    s = 0;
  }
  p->validJD = 0;
  p->rawS = 0;
  p->validHMS = 1;
  p->h = h;
  p->m = m;
  p->s = s + ms;
  if( parseTimezone(zDate, p) ) return 1;
  p->validTZ = (p->tz!=0)?1:0;
  return 0;
}